

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skip_suite.cpp
# Opt level: O1

void fail_comma_after_primitive(void)

{
  error_code ec;
  view_type skipped;
  reader reader;
  value local_180 [2];
  view_type local_178;
  view_type local_168;
  basic_reader<char> local_158;
  
  local_178._M_len = 6;
  local_178._M_str = "false,";
  trial::protocol::json::basic_reader<char>::basic_reader(&local_158,&local_178);
  local_178._M_len = local_178._M_len & 0xffffffff00000000;
  local_178._M_str = (char *)std::_V2::system_category();
  local_168 = trial::protocol::json::partial::skip<char>(&local_158,(error_code *)&local_178);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[6]>
            ("skipped","\"false\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/skip_suite.cpp"
             ,0x8e,"void fail_comma_after_primitive()",&local_168,"false");
  local_180[0] = trial::protocol::json::basic_reader<char>::symbol(&local_158);
  local_180[1] = 1;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::symbol::value,trial::protocol::json::token::symbol::value>
            ("reader.symbol()","token::symbol::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/skip_suite.cpp"
             ,0x8f,"void fail_comma_after_primitive()",local_180,local_180 + 1);
  local_180[0] = error;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::error_code,trial::protocol::json::errc>
            ("ec","json::errc::unexpected_token",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/skip_suite.cpp"
             ,0x90,"void fail_comma_after_primitive()",&local_178,local_180);
  if (local_158.stack.c.
      super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_158.stack.c.
                    super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_158.stack.c.
                          super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_158.stack.c.
                          super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void fail_comma_after_primitive()
{
    json::reader reader("false,");
    std::error_code ec;
    auto skipped = json::partial::skip(reader, ec);
    TRIAL_PROTOCOL_TEST_EQUAL(skipped, "false");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.symbol(), token::symbol::error);
    TRIAL_PROTOCOL_TEST_EQUAL(ec, json::errc::unexpected_token);
}